

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderCompilationCases.cpp
# Opt level: O2

float deqp::gles2::Performance::vectorFloatStandardDeviation<long>
                (vector<long,_std::allocator<long>_> *v)

{
  pointer plVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  fVar5 = vectorFloatAverage<long>(v);
  plVar1 = (v->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  uVar2 = (long)(v->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data
                ._M_finish - (long)plVar1 >> 3;
  uVar3 = 0;
  uVar4 = 0;
  if (0 < (int)uVar2) {
    uVar4 = uVar2 & 0xffffffff;
  }
  fVar6 = 0.0;
  for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    fVar7 = (float)plVar1[uVar3] - fVar5;
    fVar6 = fVar6 + fVar7 * fVar7;
  }
  fVar6 = fVar6 / (float)uVar2;
  if (0.0 <= fVar6) {
    return SQRT(fVar6);
  }
  fVar5 = sqrtf(fVar6);
  return fVar5;
}

Assistant:

static float vectorFloatStandardDeviation (const vector<T>& v)
{
	float average	= vectorFloatAverage(v);
	float result	= 0.0f;
	for (int i = 0; i < (int)v.size(); i++)
	{
		float d = (float)v[i] - average;
		result += d*d;
	}
	return deFloatSqrt(result/(float)v.size());
}